

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

uint64 __thiscall
xLearn::Parser::get_line_from_buffer(Parser *this,char *line,char *buf,uint64 pos,uint64 size)

{
  ostream *poVar1;
  uint64 uVar2;
  long lVar3;
  ulong __n;
  Logger local_74;
  string local_70;
  string local_50;
  uint64 uVar4;
  
  uVar2 = pos;
  if (pos < size) {
    do {
      uVar4 = uVar2;
      if (buf[uVar2] == '\n') break;
      uVar2 = uVar2 + 1;
      uVar4 = size;
    } while (size != uVar2);
    lVar3 = uVar4 - pos;
    __n = lVar3 + 1;
    if (0xa00000 < __n) {
      local_74.severity_ = FATAL;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
                 ,"");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"get_line_from_buffer","")
      ;
      poVar1 = Logger::Start(FATAL,&local_70,0x34,&local_50);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"Encountered a too-long line.                       Please check the data.",
                 0x49);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      Logger::~Logger(&local_74);
    }
    memcpy(line,buf + pos,__n);
    line[lVar3] = '\0';
    if ((1 < __n) && (line[lVar3 + -1] == '\r')) {
      line[lVar3 + -1] = '\0';
    }
  }
  else {
    __n = 0;
  }
  return __n;
}

Assistant:

uint64 Parser::get_line_from_buffer(char* line,
                                    char* buf,
                                    uint64 pos,
                                    uint64 size) {
  if (pos >= size) { return 0; }
  uint64 end_pos = pos;
  while (end_pos < size && buf[end_pos] != '\n') { end_pos++; }
  uint64 read_size = end_pos - pos + 1;
  if (read_size > kMaxLineSize) {
    LOG(FATAL) << "Encountered a too-long line.    \
                   Please check the data.";
  }
  memcpy(line, buf+pos, read_size);
  line[read_size - 1] = '\0';
  if (read_size > 1 && line[read_size - 2] == '\r') {
    // Handle some txt format in windows or DOS.
    line[read_size - 2] = '\0';
  }
  return read_size;
}